

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

QList<int> * __thiscall
QDockAreaLayoutInfo::indexOf
          (QList<int> *__return_storage_ptr__,QDockAreaLayoutInfo *this,QWidget *widget)

{
  QDockAreaLayoutItem *pQVar1;
  Data *pDVar2;
  long *plVar3;
  QWidget *pQVar4;
  ulong uVar5;
  long lVar6;
  long in_FS_OFFSET;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->item_list).d.size != 0) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      pQVar1 = (this->item_list).d.ptr;
      if (*(long *)((long)&pQVar1->placeHolderItem + lVar6) == 0) {
        if (*(long *)((long)&pQVar1->subinfo + lVar6) == 0) {
          if ((((*(byte *)((long)&pQVar1->flags + lVar6) & 1) == 0) &&
              (plVar3 = *(long **)((long)&pQVar1->widgetItem + lVar6), plVar3 != (long *)0x0)) &&
             (pQVar4 = (QWidget *)(**(code **)(*plVar3 + 0x68))(), pQVar4 == widget)) {
            (__return_storage_ptr__->d).d = (Data *)0x0;
            (__return_storage_ptr__->d).ptr = (int *)0x0;
            (__return_storage_ptr__->d).size = 0;
            local_3c = (int)uVar5;
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)__return_storage_ptr__,0,&local_3c);
            QList<int>::end(__return_storage_ptr__);
            goto LAB_003f04c2;
          }
        }
        else {
          (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          (__return_storage_ptr__->d).ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
          indexOf(__return_storage_ptr__,*(QDockAreaLayoutInfo **)((long)&pQVar1->subinfo + lVar6),
                  widget);
          if ((__return_storage_ptr__->d).size != 0) {
            local_3c = (int)uVar5;
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)__return_storage_ptr__,0,&local_3c);
LAB_003f04c2:
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              return __return_storage_ptr__;
            }
            goto LAB_003f04d2;
          }
          pDVar2 = (__return_storage_ptr__->d).d;
          if (pDVar2 != (Data *)0x0) {
            LOCK();
            (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&((__return_storage_ptr__->d).d)->super_QArrayData,4,0x10);
            }
          }
        }
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x28;
    } while (uVar5 < (ulong)(this->item_list).d.size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (int *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  }
LAB_003f04d2:
  __stack_chk_fail();
}

Assistant:

QList<int> QDockAreaLayoutInfo::indexOf(const QWidget *widget) const
{
    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);

        if (item.placeHolderItem != nullptr)
            continue;

        if (item.subinfo != nullptr) {
            QList<int> result = item.subinfo->indexOf(widget);
            if (!result.isEmpty()) {
                result.prepend(i);
                return result;
            }
            continue;
        }

        if (!(item.flags & QDockAreaLayoutItem::GapItem) && item.widgetItem && item.widgetItem->widget() == widget) {
            QList<int> result;
            result << i;
            return result;
        }
    }

    return QList<int>();
}